

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrototypeChainCache.cpp
# Opt level: O1

bool __thiscall
Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>::CheckProtoChainInternal
          (PrototypeChainCache<Js::OnlyWritablePropertyCache> *this,RecyclableObject *prototype)

{
  Type *this_00;
  ScriptContext *pSVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  undefined4 *puVar6;
  Type *pTVar7;
  bool bVar8;
  
  if (prototype == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/PrototypeChainCache.cpp"
                                ,0xc0,"(prototype)","prototype");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  this_00 = (prototype->type).ptr;
  bVar4 = true;
  bVar8 = this_00->typeId == TypeIds_Null;
  if (bVar8) {
LAB_00b0b199:
    if (bVar4) {
      Js::Type::SetAreThisAndPrototypesEnsuredToHaveOnlyWritableDataProperties(this_00,true);
    }
  }
  else if (this_00->typeId != TypeIds_Proxy) {
    pSVar1 = (((this_00->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    bVar4 = true;
    pTVar7 = this_00;
    do {
      pSVar2 = (((pTVar7->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      bVar5 = RecyclableObject::HasOnlyWritableDataProperties(prototype);
      if (!bVar5) {
        return bVar8;
      }
      if (pSVar2 != pSVar1) {
        bVar4 = false;
      }
      prototype = RecyclableObject::GetPrototype(prototype);
      pTVar7 = (prototype->type).ptr;
      bVar8 = pTVar7->typeId == TypeIds_Null;
      if (bVar8) goto LAB_00b0b199;
    } while (pTVar7->typeId != TypeIds_Proxy);
  }
  return bVar8;
}

Assistant:

bool
PrototypeChainCache<T>::CheckProtoChainInternal(RecyclableObject* prototype)
{
    Assert(prototype);

    Type *const originalType = prototype->GetType();
    ScriptContext *const scriptContext = prototype->GetScriptContext();

    bool onlyOneScriptContext = true;
    TypeId typeId;
    for (; (typeId = prototype->GetTypeId()) != TypeIds_Null; prototype = prototype->GetPrototype())
    {
        if (typeId == TypeIds_Proxy)
        {
            return false;
        }
        if (prototype->GetScriptContext() != scriptContext)
        {
            onlyOneScriptContext = false;
        }
        if (!T::CheckObject(prototype))
        {
            return false;
        }
    }

    if (onlyOneScriptContext)
    {
        // Technically, we could register all prototypes in the chain but this is good enough for now
        T::Cache(originalType);
    }

    return true;
}